

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O2

shared_ptr<duckdb::BaseUnionData,_true> __thiscall
duckdb::CSVMultiFileInfo::GetUnionData
          (CSVMultiFileInfo *this,shared_ptr<duckdb::BaseFileReader,_true> *scan_p,idx_t file_idx)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  BaseFileReader *pBVar2;
  CSVUnionData *pCVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BaseUnionData,_true> sVar4;
  shared_ptr<duckdb::CSVUnionData,_true> data;
  shared_ptr<duckdb::CSVUnionData,_true> local_38;
  
  pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(scan_p);
  shared_ptr<duckdb::BaseFileReader,_true>::operator->(scan_p);
  make_shared_ptr<duckdb::CSVUnionData,duckdb::OpenFileInfo&>((OpenFileInfo *)&local_38);
  if (file_idx == 0) {
    pCVar3 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_38);
    CSVReaderOptions::operator=
              (&pCVar3->options,(CSVReaderOptions *)&pBVar2[1].expression_map._M_h._M_element_count)
    ;
    pCVar3 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_38);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(pCVar3->super_BaseUnionData).names,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pBVar2[6].file.path._M_string_length);
    pCVar3 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_38);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pCVar3->super_BaseUnionData).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &pBVar2[6].file.extended_info);
    pCVar3 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_38);
    shared_ptr<duckdb::BaseFileReader,_true>::operator=
              (&(pCVar3->super_BaseUnionData).reader,scan_p);
  }
  else {
    pCVar3 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_38);
    CSVReaderOptions::operator=
              (&pCVar3->options,(CSVReaderOptions *)&pBVar2[1].expression_map._M_h._M_element_count)
    ;
    pCVar3 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_38);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(pCVar3->super_BaseUnionData).names,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pBVar2[6].file.path._M_string_length);
    pCVar3 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_38);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pCVar3->super_BaseUnionData).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &pBVar2[6].file.extended_info);
  }
  pCVar3 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_38);
  _Var1._M_pi = local_38.internal.
                super___shared_ptr<duckdb::CSVUnionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  (pCVar3->options).auto_detect = false;
  local_38.internal.super___shared_ptr<duckdb::CSVUnionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this =
       local_38.internal.super___shared_ptr<duckdb::CSVUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_38.internal.super___shared_ptr<duckdb::CSVUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.internal.super___shared_ptr<duckdb::CSVUnionData,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar4.internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BaseUnionData,_true>)
         sVar4.internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseUnionData> CSVMultiFileInfo::GetUnionData(shared_ptr<BaseFileReader> scan_p, idx_t file_idx) {
	auto &scan = scan_p->Cast<CSVFileScan>();
	auto data = make_shared_ptr<CSVUnionData>(scan_p->file);
	if (file_idx == 0) {
		data->options = scan.options;
		data->names = scan.GetNames();
		data->types = scan.GetTypes();
		data->reader = std::move(scan_p);
	} else {
		data->options = std::move(scan.options);
		data->names = scan.GetNames();
		data->types = scan.GetTypes();
	}
	data->options.auto_detect = false;
	return data;
}